

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int get_obmc_mvpred_var(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  FULLPEL_MV *in_RSI;
  long in_RDI;
  uint unused;
  MV mv;
  buf_2d *ref_buf;
  int32_t *mask;
  int32_t *wsrc;
  MSBuffers *ms_buffers;
  MV_COST_PARAMS *mv_cost_params;
  aom_variance_fn_ptr_t *vfp;
  FULLPEL_MV *mv_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_48 [4];
  MV local_44;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  long *local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 8);
  local_20 = in_RDI + 0x98;
  local_28 = (long *)(in_RDI + 0x10);
  local_30 = *(undefined8 *)(in_RDI + 0x38);
  local_38 = *(undefined8 *)(in_RDI + 0x40);
  local_40 = *local_28;
  local_44 = get_mv_from_fullmv(in_RSI);
  mv_00 = *(FULLPEL_MV **)(local_18 + 0x60);
  puVar3 = get_buf_from_fullmv((buf_2d *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),mv_00);
  iVar1 = (*(code *)mv_00)(puVar3,*(undefined4 *)(local_40 + 0x18),local_30,local_38,local_48);
  iVar2 = mv_err_cost_((MV *)mv_00,(MV_COST_PARAMS *)0x26de40);
  return iVar1 + iVar2;
}

Assistant:

static inline int get_obmc_mvpred_var(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *ref_buf = ms_buffers->ref;

  const MV mv = get_mv_from_fullmv(this_mv);
  unsigned int unused;

  return vfp->ovf(get_buf_from_fullmv(ref_buf, this_mv), ref_buf->stride, wsrc,
                  mask, &unused) +
         mv_err_cost_(&mv, mv_cost_params);
}